

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O2

void __thiscall
bwtil::HuffmanTree<unsigned_char>::storeTree
          (HuffmanTree<unsigned_char> *this,Node n,
          vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
          *nodes_vec)

{
  _Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  local_50;
  _Bvector_base<std::allocator<bool>_> local_38;
  
  local_38._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  std::
  vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::vector((vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
            *)&local_50,nodes_vec);
  storeTree(this,(vector<bool,_std::allocator<bool>_> *)&local_38,n,
            (vector<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
             *)&local_50);
  std::
  _Vector_base<bwtil::HuffmanTree<unsigned_char>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_char>::Node>_>
  ::~_Vector_base(&local_50);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_38);
  return;
}

Assistant:

void storeTree(Node n,vector<Node> nodes_vec){

			//root_node = n.node_number;
			storeTree(vector<bool>(),n,nodes_vec);

		}